

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

void L16toGry(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  ulong uVar3;
  uint8_t *gp;
  long lVar4;
  double dVar5;
  
  if (0 < n) {
    puVar1 = sp->tbuf;
    uVar3 = n + 1;
    lVar4 = 0;
    do {
      dVar5 = LogL16toY((int)*(short *)(puVar1 + lVar4 * 2));
      if (dVar5 <= 0.0) {
        uVar2 = '\0';
      }
      else {
        uVar2 = 0xff;
        if (dVar5 < 1.0) {
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          uVar2 = (uint8_t)(int)(dVar5 * 256.0);
        }
      }
      op[lVar4] = uVar2;
      uVar3 = uVar3 - 1;
      lVar4 = lVar4 + 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

static void L16toGry(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    int16_t *l16 = (int16_t *)sp->tbuf;
    uint8_t *gp = (uint8_t *)op;

    while (n-- > 0)
    {
        double Y = LogL16toY(*l16++);
        *gp++ = (uint8_t)((Y <= 0.)   ? 0
                          : (Y >= 1.) ? 255
                                      : (int)(256. * sqrt(Y)));
    }
}